

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar1;
  iterator iVar2;
  bool bVar3;
  int iVar4;
  int i;
  uint index;
  Hasher *set;
  SetKey<int,_Negation<int>_> *set_00;
  AssertionResult gtest_ar__5;
  Alloc<int,_unsigned_long,_18446744073709551615UL> alloc;
  AssertionResult gtest_ar_;
  hasher hasher;
  TypeParam ht3;
  TypeParam ht1;
  TypeParam ht2;
  AssertHelper local_2a0;
  undefined8 *local_298;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_290;
  AssertHelper local_288;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_280;
  pair<google::sparse_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_270;
  Hasher local_21c;
  undefined1 local_210 [16];
  char local_200 [64];
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  local_1c0 [2];
  undefined **local_170;
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_168;
  undefined **local_d0;
  int *local_c8 [9];
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  local_80 [2];
  
  local_210._0_8_ = (pointer)0x0;
  local_210._8_8_ = local_210._8_8_ & 0xffffffff00000000;
  local_270.first.ht =
       (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_270.first.pos.row_begin._M_current =
       local_270.first.pos.row_begin._M_current & 0xffffffff00000000;
  local_d0 = (undefined **)((ulong)local_d0 & 0xffffffff00000000);
  local_c8[0] = (int *)0x0;
  local_170 = &PTR__BaseHashtableInterface_00c23ed8;
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(&local_168,0,(TransparentHasher *)local_210,(TransparentHasher *)&local_270,
                     (Negation<int> *)&local_280,(SetKey<int,_Negation<int>_> *)&local_2a0,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_d0);
  local_170 = &PTR__BaseHashtableInterface_00c23e58;
  local_270.first.ht =
       (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_270.first.pos.row_begin._M_current =
       local_270.first.pos.row_begin._M_current & 0xffffffff00000000;
  local_280._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_280.count_ = (int *)((ulong)local_280.count_._4_4_ << 0x20);
  local_210._0_8_ = local_210._0_8_ & 0xffffffff00000000;
  local_210._8_8_ = (int *)0x0;
  local_d0 = &PTR__BaseHashtableInterface_00c23ed8;
  set = &local_21c;
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_c8,0,(TransparentHasher *)&local_270,(TransparentHasher *)&local_280,
                     (Negation<int> *)&local_2a0,(SetKey<int,_Negation<int>_> *)set,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_210);
  local_d0 = &PTR__BaseHashtableInterface_00c23e58;
  bVar3 = google::
          sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_168,
                       (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)local_c8);
  local_270.first.ht =
       (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_270.first.ht._1_7_,bVar3);
  local_270.first.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_210,(internal *)&local_270,(AssertionResult *)"ht1 == ht2","false",
               "true",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x42e,(char *)local_210._0_8_);
    testing::internal::AssertHelper::operator=(&local_2a0,(Message *)&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    if ((char *)local_210._0_8_ != local_200) {
      operator_delete((void *)local_210._0_8_);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_280._0_8_ + 8))();
    }
  }
  iVar2._M_current = local_270.first.pos.row_begin._M_current;
  if (local_270.first.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_270.first.pos.row_begin._M_current)->group !=
        &((local_270.first.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_270.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar2._M_current);
  }
  bVar3 = google::
          sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_168,
                       (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)local_c8);
  local_270.first.ht =
       (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_270.first.ht._1_7_,bVar3);
  local_270.first.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_210,(internal *)&local_270,(AssertionResult *)"ht1 != ht2","true",
               "false",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x42f,(char *)local_210._0_8_);
    testing::internal::AssertHelper::operator=(&local_2a0,(Message *)&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    if ((char *)local_210._0_8_ != local_200) {
      operator_delete((void *)local_210._0_8_);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_280._0_8_ + 8))();
    }
  }
  iVar2._M_current = local_270.first.pos.row_begin._M_current;
  if (local_270.first.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_270.first.pos.row_begin._M_current)->group !=
        &((local_270.first.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_270.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar2._M_current);
  }
  iVar4 = UniqueObjectHelper<int>(1);
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&local_168);
  local_168.key_info.delkey = -iVar4;
  local_168.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  use_deleted_ = true;
  bVar3 = google::
          sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_168,
                       (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)local_c8);
  local_270.first.ht =
       (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_270.first.ht._1_7_,bVar3);
  local_270.first.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_210,(internal *)&local_270,(AssertionResult *)"ht1 == ht2","false",
               "true",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x432,(char *)local_210._0_8_);
    testing::internal::AssertHelper::operator=(&local_2a0,(Message *)&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    if ((char *)local_210._0_8_ != local_200) {
      operator_delete((void *)local_210._0_8_);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_280._0_8_ + 8))();
    }
  }
  iVar2._M_current = local_270.first.pos.row_begin._M_current;
  if (local_270.first.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_270.first.pos.row_begin._M_current)->group !=
        &((local_270.first.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_270.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar2._M_current);
  }
  bVar3 = google::
          sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_168,
                       (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)local_c8);
  local_270.first.ht =
       (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_270.first.ht._1_7_,bVar3);
  local_270.first.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_210,(internal *)&local_270,(AssertionResult *)"ht1 != ht2","true",
               "false",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x433,(char *)local_210._0_8_);
    testing::internal::AssertHelper::operator=(&local_2a0,(Message *)&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    if ((char *)local_210._0_8_ != local_200) {
      operator_delete((void *)local_210._0_8_);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_280._0_8_ + 8))();
    }
  }
  iVar2._M_current = local_270.first.pos.row_begin._M_current;
  if (local_270.first.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_270.first.pos.row_begin._M_current)->group !=
        &((local_270.first.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_270.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar2._M_current);
  }
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize(&local_168,2000);
  bVar3 = google::
          sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_168,
                       (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)local_c8);
  local_270.first.ht =
       (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_270.first.ht._1_7_,bVar3);
  local_270.first.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_210,(internal *)&local_270,(AssertionResult *)"ht1 == ht2","false",
               "true",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x435,(char *)local_210._0_8_);
    testing::internal::AssertHelper::operator=(&local_2a0,(Message *)&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    if ((char *)local_210._0_8_ != local_200) {
      operator_delete((void *)local_210._0_8_);
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_280._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_280._0_8_ + 8))();
    }
  }
  iVar2._M_current = local_270.first.pos.row_begin._M_current;
  if (local_270.first.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_270.first.pos.row_begin._M_current)->group !=
        &((local_270.first.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_270.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar2._M_current);
  }
  local_21c.id_ = 1;
  local_21c.num_hashes_ = 0;
  local_21c.num_compares_ = 0;
  local_280.id_ = 2;
  local_280.count_ = (int *)0x0;
  this_00 = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)(local_210 + 8);
  local_210._0_8_ = &PTR__BaseHashtableInterface_00c23ed8;
  set_00 = (SetKey<int,_Negation<int>_> *)&local_2a0;
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(this_00,5,(TransparentHasher *)&local_21c,(TransparentHasher *)&local_21c,
                     (Negation<int> *)&local_270,set_00,&local_280);
  local_210._0_8_ = &PTR__BaseHashtableInterface_00c23e58;
  bVar3 = google::
          sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_168,this_00);
  local_2a0.data_._0_4_ = CONCAT31(local_2a0.data_._1_3_,bVar3);
  local_298 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_270,(internal *)&local_2a0,(AssertionResult *)"ht1 == ht3","false",
               "true",(char *)set_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43b,(char *)local_270.first.ht);
    testing::internal::AssertHelper::operator=(&local_288,(Message *)&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    if (local_270.first.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_270.first.pos + 8U)) {
      operator_delete(local_270.first.ht);
    }
    if (local_290._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_290._M_head_impl + 8))();
    }
  }
  puVar1 = local_298;
  if (local_298 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_298 != local_298 + 2) {
      operator_delete((undefined8 *)*local_298);
    }
    operator_delete(puVar1);
  }
  bVar3 = google::
          sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_168,this_00);
  local_2a0.data_._0_4_ = CONCAT31(local_2a0.data_._1_3_,bVar3);
  local_298 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_270,(internal *)&local_2a0,(AssertionResult *)"ht1 != ht3","true",
               "false",(char *)set_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43c,(char *)local_270.first.ht);
    testing::internal::AssertHelper::operator=(&local_288,(Message *)&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    if (local_270.first.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_270.first.pos + 8U)) {
      operator_delete(local_270.first.ht);
    }
    if (local_290._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_290._M_head_impl + 8))();
    }
  }
  puVar1 = local_298;
  if (local_298 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_298 != local_298 + 2) {
      operator_delete((undefined8 *)*local_298);
    }
    operator_delete(puVar1);
  }
  local_2a0.data_._0_4_ = UniqueObjectHelper<int>(2);
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&local_168,1);
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize(&local_270,&local_168,(const_reference)&local_2a0);
  bVar3 = google::
          sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_168,
                       (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)local_c8);
  local_2a0.data_._0_4_ = CONCAT31(local_2a0.data_._1_3_,!bVar3);
  local_298 = (undefined8 *)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_270,(internal *)&local_2a0,(AssertionResult *)"ht1 != ht2","false",
               "true",(char *)set_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43f,(char *)local_270.first.ht);
    testing::internal::AssertHelper::operator=(&local_288,(Message *)&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    if (local_270.first.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_270.first.pos + 8U)) {
      operator_delete(local_270.first.ht);
    }
    if (local_290._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_290._M_head_impl + 8))();
    }
  }
  puVar1 = local_298;
  if (local_298 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_298 != local_298 + 2) {
      operator_delete((undefined8 *)*local_298);
    }
    operator_delete(puVar1);
  }
  bVar3 = google::
          sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_168,
                       (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)local_c8);
  local_2a0.data_._0_4_ = CONCAT31(local_2a0.data_._1_3_,!bVar3);
  local_298 = (undefined8 *)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_270,(internal *)&local_2a0,(AssertionResult *)"ht1 == ht2","true",
               "false",(char *)set_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x440,(char *)local_270.first.ht);
    testing::internal::AssertHelper::operator=(&local_288,(Message *)&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    if (local_270.first.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_270.first.pos + 8U)) {
      operator_delete(local_270.first.ht);
    }
    if (local_290._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_290._M_head_impl + 8))();
    }
  }
  puVar1 = local_298;
  if (local_298 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_298 != local_298 + 2) {
      operator_delete((undefined8 *)*local_298);
    }
    operator_delete(puVar1);
  }
  local_2a0.data_._0_4_ = UniqueObjectHelper<int>(2);
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta((sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_c8,1);
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize(&local_270,
                    (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                     *)local_c8,(const_reference)&local_2a0);
  bVar3 = google::
          sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_168,
                       (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)local_c8);
  local_2a0.data_._0_4_ = CONCAT31(local_2a0.data_._1_3_,bVar3);
  local_298 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_270,(internal *)&local_2a0,(AssertionResult *)"ht1 == ht2","false",
               "true",(char *)set_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x443,(char *)local_270.first.ht);
    testing::internal::AssertHelper::operator=(&local_288,(Message *)&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    if (local_270.first.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_270.first.pos + 8U)) {
      operator_delete(local_270.first.ht);
    }
    if (local_290._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_290._M_head_impl + 8))();
    }
  }
  puVar1 = local_298;
  if (local_298 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_298 != local_298 + 2) {
      operator_delete((undefined8 *)*local_298);
    }
    operator_delete(puVar1);
  }
  iVar4 = 3;
  do {
    local_2a0.data_._0_4_ = UniqueObjectHelper<int>(iVar4);
    google::
    sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(&local_168,1);
    google::
    sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize(&local_270,&local_168,(const_reference)&local_2a0);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x7d1);
  index = 0x7d1;
  do {
    index = index - 1;
    local_2a0.data_._0_4_ = UniqueObjectHelper<int>(index);
    google::
    sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta((sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_c8,1);
    google::
    sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize(&local_270,
                      (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                       *)local_c8,(const_reference)&local_2a0);
  } while (3 < index);
  bVar3 = google::
          sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_168,
                       (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)local_c8);
  local_2a0.data_._0_4_ = CONCAT31(local_2a0.data_._1_3_,bVar3);
  local_298 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_270,(internal *)&local_2a0,(AssertionResult *)"ht1 == ht2","false",
               "true",(char *)set_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,1099,(char *)local_270.first.ht);
    testing::internal::AssertHelper::operator=(&local_288,(Message *)&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    if (local_270.first.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_270.first.pos + 8U)) {
      operator_delete(local_270.first.ht);
    }
    if (local_290._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_290._M_head_impl + 8))();
    }
  }
  puVar1 = local_298;
  if (local_298 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_298 != local_298 + 2) {
      operator_delete((undefined8 *)*local_298);
    }
    operator_delete(puVar1);
  }
  local_210._0_8_ = &PTR__BaseHashtableInterface_00c23ed8;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(local_1c0);
  local_d0 = &PTR__BaseHashtableInterface_00c23ed8;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(local_80);
  local_170 = &PTR__BaseHashtableInterface_00c23ed8;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_168.table.groups);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}